

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_test_image_function.cpp
# Opt level: O0

bool Function_Template::form3_RgbToBgr(RgbToBgrForm3 RgbToBgr)

{
  uint8_t value;
  bool bVar1;
  Image *image;
  reference __b;
  code *in_RDI;
  Image output;
  uint32_t roiHeight;
  uint32_t roiWidth;
  uint32_t roiY;
  uint32_t roiX;
  vector<unsigned_char,_std::allocator<unsigned_char>_> intensity;
  Image input;
  uint32_t in_stack_ffffffffffffff18;
  uint32_t in_stack_ffffffffffffff1c;
  undefined5 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff25;
  uint8_t in_stack_ffffffffffffff26;
  uint8_t in_stack_ffffffffffffff27;
  byte bVar2;
  uint32_t *in_stack_ffffffffffffff28;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  Image *in_stack_ffffffffffffff30;
  undefined1 local_b8 [32];
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff68;
  uint32_t in_stack_ffffffffffffff70;
  uint32_t in_stack_ffffffffffffff74;
  uint32_t in_stack_ffffffffffffff78;
  uint32_t in_stack_ffffffffffffff7c;
  Image *in_stack_ffffffffffffff80;
  undefined1 local_30 [40];
  code *local_8;
  
  local_8 = in_RDI;
  value = Unit_Test::intensityValue();
  PenguinV_Image::ImageTemplate<unsigned_char>::ImageTemplate
            (in_stack_ffffffffffffff30,(uint32_t)((ulong)in_stack_ffffffffffffff28 >> 0x20),
             (uint32_t)in_stack_ffffffffffffff28,in_stack_ffffffffffffff27,in_stack_ffffffffffffff26
            );
  Test_Helper::uniformRGBImage(value,in_stack_ffffffffffffff30);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1e0abf);
  Unit_Test::intensityArray(in_stack_ffffffffffffff1c);
  Unit_Test::generateRoi
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
             (uint32_t *)
             CONCAT17(in_stack_ffffffffffffff27,
                      CONCAT16(in_stack_ffffffffffffff26,
                               CONCAT15(in_stack_ffffffffffffff25,in_stack_ffffffffffffff20))),
             (uint32_t *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18),
             (uint32_t *)0x1e0af1);
  Unit_Test::fillImage
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,
             in_stack_ffffffffffffff74,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  (*local_8)(local_b8,local_30,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78,
             in_stack_ffffffffffffff74,in_stack_ffffffffffffff70);
  this = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&stack0xffffffffffffff80;
  image = (Image *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](this,0);
  __b = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](this,2);
  std::swap<unsigned_char>((uchar *)image,__b);
  bVar1 = Unit_Test::equalSize
                    ((Image *)CONCAT17(in_stack_ffffffffffffff27,
                                       CONCAT16(in_stack_ffffffffffffff26,
                                                CONCAT15(in_stack_ffffffffffffff25,
                                                         in_stack_ffffffffffffff20))),
                     in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18);
  bVar2 = false;
  if (bVar1) {
    bVar2 = Unit_Test::verifyImage(image,this,false);
  }
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1e0bd3);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)image);
  PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
            ((ImageTemplate<unsigned_char> *)0x1e0bea);
  return (bool)(bVar2 & 1);
}

Assistant:

bool form3_RgbToBgr(RgbToBgrForm3 RgbToBgr)
    {
        PenguinV_Image::Image input = uniformRGBImage( intensityValue() );
        std::vector< uint8_t > intensity = intensityArray( 3 );

        uint32_t roiX, roiY, roiWidth, roiHeight;
        generateRoi( input, roiX, roiY, roiWidth, roiHeight );

        fillImage( input, roiX, roiY, roiWidth, roiHeight, intensity );

        const PenguinV_Image::Image output = RgbToBgr( input, roiX, roiY, roiWidth, roiHeight );

        std::swap( intensity[0], intensity[2] );

        return equalSize( output, roiWidth, roiHeight ) && verifyImage( output, intensity, false );
    }